

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx512::forward
          (Yolov3DetectionOutput_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  uint uVar4;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  const_iterator __position;
  ulong uVar5;
  size_type sVar6;
  Mat *pMVar7;
  reference pvVar8;
  reference pvVar9;
  _func_int **pp_Var10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  int mask;
  __m256 mi;
  float score;
  __m256 t;
  __m256 p_1;
  unsigned_long index;
  float *end8;
  int q;
  float *end;
  float *ptr;
  float class_score;
  int class_index;
  int j;
  int i;
  __m256i vi;
  int cs;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_5;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff1e0;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  *in_stack_fffffffffffff1e8;
  undefined7 in_stack_fffffffffffff1f0;
  undefined1 in_stack_fffffffffffff1f7;
  Yolov3DetectionOutput *in_stack_fffffffffffff1f8;
  Yolov3DetectionOutput *pYVar15;
  int in_stack_fffffffffffff200;
  int in_stack_fffffffffffff204;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  *in_stack_fffffffffffff208;
  Mat *this_00;
  iterator in_stack_fffffffffffff220;
  float fVar16;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff228;
  float in_stack_fffffffffffff230;
  float in_stack_fffffffffffff234;
  float in_stack_fffffffffffff238;
  float in_stack_fffffffffffff23c;
  float in_stack_fffffffffffff240;
  float in_stack_fffffffffffff244;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  int local_b54;
  Mat *local_b38;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_b30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b18;
  BBoxRect *local_b00;
  BBoxRect *local_af8;
  BBoxRect *local_af0;
  BBoxRect *local_ae8;
  reference local_ad8;
  int local_acc;
  float local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  float local_ab4;
  int local_ab0;
  float local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined4 local_a9c;
  float local_a98;
  float local_a94;
  float local_a90;
  float local_a8c;
  float local_a88;
  uint local_a84;
  undefined1 local_a80 [32];
  float local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [32];
  long local_9f8;
  float *local_9f0;
  int local_9e4;
  float *local_9e0;
  float *local_9d8;
  float local_9d0;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  int local_994;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_990;
  int local_978;
  Allocator *local_970;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  undefined4 local_958;
  int local_950;
  undefined8 local_948;
  undefined8 local_940;
  undefined8 local_938;
  undefined4 local_930;
  Allocator *local_928;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined8 local_908;
  uint *local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0;
  Allocator *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined8 local_8b8;
  uint *local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined4 local_890;
  Allocator *local_888;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined8 local_868;
  uint *local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined4 local_840;
  Allocator *local_838;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined8 local_818;
  void *local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  Allocator *local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined8 local_7c8;
  void *local_7c0;
  float local_7b4;
  float local_7b0;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  long local_798;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  const_reference local_778;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_760;
  ulong local_748;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_740;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_720;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_718;
  int local_704;
  long local_700;
  long *local_6f8;
  long local_6f0;
  long *local_6e8;
  long local_6e0;
  long *local_6d8;
  ulong local_6d0;
  long *local_6c8;
  ulong local_6c0;
  long *local_6b8;
  undefined1 local_6ad;
  int local_6ac;
  const_reference local_6a8;
  undefined8 *local_6a0;
  undefined1 local_695;
  int local_694;
  const_reference local_690;
  undefined8 *local_688;
  undefined1 local_67d;
  int local_67c;
  const_reference local_678;
  undefined8 *local_670;
  undefined1 local_665;
  int local_664;
  const_reference local_660;
  undefined8 *local_658;
  undefined1 local_64d;
  int local_64c;
  const_reference local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_5e8;
  undefined8 *local_5d8;
  undefined8 *local_5c8;
  undefined8 *local_5b8;
  undefined8 *local_5a8;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_598;
  undefined1 local_581;
  undefined4 local_580;
  int local_57c;
  const_reference local_578;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_570;
  int local_560;
  int local_55c;
  int local_558;
  uint local_554;
  int local_550;
  int local_54c;
  int local_548;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  Yolov3DetectionOutput *local_3f8;
  int local_3ec;
  Yolov3DetectionOutput *local_3e8;
  Allocator *local_3e0;
  int local_3d4;
  size_t local_3d0;
  void *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  undefined8 *local_3b0;
  Allocator *local_3a8;
  int local_39c;
  size_t local_398;
  void *local_390;
  int local_384;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  Allocator *local_370;
  int local_364;
  size_t local_360;
  uint *local_358;
  int local_34c;
  int local_348;
  int local_344;
  undefined8 *local_340;
  Allocator *local_338;
  int local_32c;
  size_t local_328;
  uint *local_320;
  int local_314;
  int local_310;
  int local_30c;
  undefined8 *local_308;
  Allocator *local_300;
  int local_2f4;
  size_t local_2f0;
  uint *local_2e8;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  undefined4 local_2a4;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  float local_258;
  undefined4 local_254;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_250;
  undefined8 *local_230;
  undefined8 *local_210;
  undefined8 *local_1f0;
  undefined8 *local_1d0;
  undefined8 *local_1b0;
  Allocator *local_c8;
  int local_bc;
  pointer local_b8;
  pointer local_b0;
  undefined4 local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_98;
  undefined4 local_8c;
  long local_88;
  undefined1 local_80 [32];
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  Yolov3DetectionOutput *local_38;
  
  local_720 = in_RDX;
  local_718 = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a38bdc);
  local_748 = 0;
  while( true ) {
    uVar5 = local_748;
    sVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_718);
    fVar16 = (float)((ulong)in_stack_fffffffffffff220._M_current >> 0x20);
    if (sVar6 <= uVar5) break;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x1a38c2e);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(in_stack_fffffffffffff208,CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200)
            );
    local_778 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_718,local_748);
    local_77c = local_778->w;
    local_780 = local_778->h;
    local_784 = local_778->c;
    local_788 = local_784 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (local_788 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 5) {
      local_798 = local_748 * (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_6b8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170);
      local_6c0 = local_748;
      local_79c = (int)(*(float *)(*local_6b8 + local_748 * 4) * (float)local_77c);
      local_6c8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170);
      local_6d0 = local_748;
      local_7a0 = (int)(*(float *)(*local_6c8 + local_748 * 4) * (float)local_780);
      for (local_7a4 = 0; local_7a4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_7a4 = local_7a4 + 1) {
        local_7a8 = local_7a4 * local_788;
        local_6d8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128);
        local_6e0 = local_7a4 + local_798;
        local_7ac = (int)*(float *)(*local_6d8 + local_6e0 * 4);
        local_6e8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        local_6f0 = (long)(local_7ac << 1);
        local_7b0 = *(float *)(*local_6e8 + local_6f0 * 4);
        local_6f8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        local_700 = (long)(local_7ac * 2 + 1);
        local_7b4 = *(float *)(*local_6f8 + local_700 * 4);
        local_640 = &local_808;
        local_3b4 = local_778->w;
        local_3b8 = local_778->h;
        local_3bc = local_778->d;
        local_7c0 = (void *)((long)local_778->data +
                            local_778->cstep * (long)local_7a8 * local_778->elemsize);
        local_3d0 = local_778->elemsize;
        local_3d4 = local_778->elempack;
        local_3e0 = local_778->allocator;
        local_3b0 = &local_808;
        local_280 = (long)local_3b4 * (long)local_3b8 * local_3d0;
        local_618 = &local_808;
        local_5e8 = &local_808;
        local_664 = local_7a8 + 1;
        local_658 = &local_858;
        local_37c = local_778->w;
        local_380 = local_778->h;
        local_384 = local_778->d;
        local_810 = (void *)((long)local_778->data +
                            local_778->cstep * (long)local_664 * local_778->elemsize);
        local_398 = local_778->elemsize;
        local_39c = local_778->elempack;
        local_3a8 = local_778->allocator;
        local_378 = &local_858;
        local_290 = (long)local_37c * (long)local_380 * local_398;
        local_620 = &local_858;
        local_5d8 = &local_858;
        local_67c = local_7a8 + 2;
        local_670 = &local_8a8;
        local_344 = local_778->w;
        local_348 = local_778->h;
        local_34c = local_778->d;
        local_860 = (uint *)((long)local_778->data +
                            local_778->cstep * (long)local_67c * local_778->elemsize);
        local_360 = local_778->elemsize;
        local_364 = local_778->elempack;
        local_370 = local_778->allocator;
        local_340 = &local_8a8;
        local_2a0 = (long)local_344 * (long)local_348 * local_360;
        local_628 = &local_8a8;
        local_5c8 = &local_8a8;
        local_694 = local_7a8 + 3;
        local_688 = &local_8f8;
        local_30c = local_778->w;
        local_310 = local_778->h;
        local_314 = local_778->d;
        local_8b0 = (uint *)((long)local_778->data +
                            local_778->cstep * (long)local_694 * local_778->elemsize);
        local_328 = local_778->elemsize;
        local_32c = local_778->elempack;
        local_338 = local_778->allocator;
        local_308 = &local_8f8;
        local_2b0 = (long)local_30c * (long)local_310 * local_328;
        local_630 = &local_8f8;
        local_5b8 = &local_8f8;
        local_6ac = local_7a8 + 4;
        local_6a0 = &local_948;
        local_2d4 = local_778->w;
        local_2d8 = local_778->h;
        local_2dc = local_778->d;
        local_900 = (uint *)((long)local_778->data +
                            local_778->cstep * (long)local_6ac * local_778->elemsize);
        local_2f0 = local_778->elemsize;
        local_2f4 = local_778->elempack;
        local_300 = local_778->allocator;
        local_2d0 = &local_948;
        local_2c0 = (long)local_2d4 * (long)local_2d8 * local_2f0;
        local_638 = &local_948;
        local_5a8 = &local_948;
        local_7d0 = 0;
        local_7d4 = 0;
        local_7d8 = 0;
        local_7dc = 0;
        local_7f0 = 0;
        local_7f8 = 0;
        local_800 = 0;
        local_808 = 0;
        local_820 = 0;
        local_824 = 0;
        local_828 = 0;
        local_82c = 0;
        local_840 = 0;
        local_848 = 0;
        local_850 = 0;
        local_858 = 0;
        local_870 = 0;
        local_874 = 0;
        local_878 = 0;
        local_87c = 0;
        local_890 = 0;
        local_898 = 0;
        local_8a0 = 0;
        local_8a8 = 0;
        local_8c0 = 0;
        local_8c4 = 0;
        local_8c8 = 0;
        local_8cc = 0;
        local_8e0 = 0;
        local_8e8 = 0;
        local_8f0 = 0;
        local_8f8 = 0;
        local_284 = 0x10;
        local_294 = 0x10;
        local_2a4 = 0x10;
        local_2b4 = 0x10;
        local_2c4 = 0x10;
        local_648 = local_778;
        local_64d = 1;
        local_660 = local_778;
        local_665 = 1;
        local_678 = local_778;
        local_67d = 1;
        local_690 = local_778;
        local_695 = 1;
        local_6a8 = local_778;
        local_6ad = 1;
        local_7c8 = 0;
        local_7e0 = 0;
        local_818 = 0;
        local_830 = 0;
        local_868 = 0;
        local_880 = 0;
        local_8b8 = 0;
        local_8d0 = 0;
        local_57c = local_7a8 + 5;
        local_580 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_570 = &local_990;
        local_9c = local_778->w;
        local_a0 = local_778->h;
        local_a4 = local_778->d;
        local_990.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)local_778->data +
                      local_778->cstep * (long)local_57c * local_778->elemsize);
        local_b8 = (pointer)local_778->elemsize;
        local_bc = local_778->elempack;
        local_c8 = local_778->allocator;
        local_98 = &local_990;
        local_88 = (long)local_9c * (long)local_a0 * (long)local_a4 * (long)local_b8;
        local_950 = (int)((local_88 + 0xfU & 0xfffffffffffffff0) / (ulong)local_b8);
        local_968 = local_778->dims;
        local_910 = 0;
        local_914 = 0;
        local_918 = 0;
        local_91c = 0;
        local_930 = 0;
        local_938 = 0;
        local_940 = 0;
        local_948 = 0;
        local_8c = 0x10;
        local_578 = local_778;
        local_581 = 1;
        local_908 = 0;
        local_920 = 0;
        local_990.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_994 = local_950;
        local_54c = local_950 * 2;
        local_550 = local_950 * 3;
        local_554 = local_950 << 2;
        local_558 = local_950 * 5;
        local_55c = local_950 * 6;
        local_560 = local_950 * 7;
        local_544 = 0;
        local_548 = local_950;
        local_54 = local_950;
        local_58 = 0;
        auVar2 = vpinsrd_avx(ZEXT416(local_554),local_558,1);
        auVar2 = vpinsrd_avx(auVar2,local_55c,2);
        auVar2 = vpinsrd_avx(auVar2,local_560,3);
        auVar14 = vpinsrd_avx(ZEXT416(0),local_950,1);
        auVar14 = vpinsrd_avx(auVar14,local_54c,2);
        auVar14 = vpinsrd_avx(auVar14,local_550,3);
        local_80._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar14;
        local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
        local_64c = local_7a8;
        local_3c8 = local_7c0;
        local_390 = local_810;
        local_358 = local_860;
        local_320 = local_8b0;
        local_2e8 = local_900;
        local_230 = local_5a8;
        local_210 = local_5b8;
        local_1f0 = local_5c8;
        local_1d0 = local_5d8;
        local_1b0 = local_5e8;
        local_b0 = local_990.
                   super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_a8 = local_580;
        local_50 = local_54c;
        local_4c = local_550;
        local_48 = local_554;
        local_44 = local_558;
        local_40 = local_55c;
        local_3c = local_560;
        local_9c0 = local_80._0_16_;
        auStack_9b0 = local_80._16_16_;
        local_990.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
        local_978 = local_bc;
        local_970 = local_c8;
        local_964 = local_9c;
        local_960 = local_a0;
        local_95c = local_a4;
        local_958 = local_580;
        local_928 = local_300;
        local_8d8 = local_338;
        local_888 = local_370;
        local_838 = local_3a8;
        local_7e8 = local_3e0;
        for (local_9c4 = 0; local_9c4 < local_780; local_9c4 = local_9c4 + 1) {
          for (local_9c8 = 0; local_9c8 < local_77c; local_9c8 = local_9c8 + 1) {
            local_9cc = 0;
            local_9d0 = -3.4028235e+38;
            local_9d8 = &(local_990.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start)->score +
                        (long)(local_9c4 * local_77c) + (long)local_9c8;
            local_9e0 = local_9d8 +
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * local_994;
            local_9e4 = 0;
            local_9f0 = local_9d8 +
                        (int)((*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) &
                              0xfffffff8) * local_994);
            for (; local_9d8 < local_9f0; local_9d8 = local_9d8 + (local_994 << 3)) {
              local_520 = 0;
              uStack_518 = 0;
              uStack_510 = 0;
              uStack_508 = 0;
              local_540 = 0;
              uStack_538 = 0;
              uStack_530 = 0;
              uStack_528 = 0;
              auVar1 = vcmpps_avx(ZEXT1632(ZEXT816(0)),ZEXT1632(ZEXT816(0)),0);
              local_a20 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar1);
              local_480 = vpermpd_avx2(local_a20,0x4e);
              local_4a0 = vmaxps_avx(local_a20,local_480);
              local_4c0 = vpermilpd_avx(local_4a0,5);
              local_4e0 = vmaxps_avx(local_4a0,local_4c0);
              local_500 = vpermilps_avx(local_4e0,0xb1);
              auVar1 = vmaxps_avx(local_4e0,local_500);
              local_da0 = auVar1._0_8_;
              local_a40 = local_da0;
              uStack_d98 = auVar1._8_8_;
              uStack_a38 = uStack_d98;
              uStack_d90 = auVar1._16_8_;
              uStack_a30 = uStack_d90;
              uStack_d88 = auVar1._24_8_;
              uStack_a28 = uStack_d88;
              uStack_428 = uStack_d98;
              local_430._0_4_ = auVar1._0_4_;
              local_a44 = (float)local_430;
              if (local_9d0 < (float)local_430) {
                uVar3 = vcmpps_avx512vl(local_a20,auVar1,0);
                local_a80 = vpmovm2d_avx512vl(uVar3);
                local_420 = local_a80._0_8_;
                uStack_418 = local_a80._8_8_;
                uStack_410 = local_a80._16_8_;
                uStack_408 = local_a80._24_8_;
                local_a84 = vmovmskps_avx(local_a80);
                local_9cc = 0;
                for (uVar4 = local_a84; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
                  local_9cc = local_9cc + 1;
                }
                local_9f8 = (long)local_9cc;
                local_9cc = local_9e4 + local_9cc;
                local_9d0 = (float)local_430;
              }
              local_9e4 = local_9e4 + 8;
              local_460 = local_a20;
              local_430 = local_da0;
            }
            for (; local_9d8 < local_9e0; local_9d8 = local_9d8 + local_994) {
              if (local_9d0 < *local_9d8) {
                local_9cc = local_9e4;
                local_9d0 = *local_9d8;
              }
              local_9e4 = local_9e4 + 1;
            }
            dVar12 = std::exp((double)((ulong)*local_900 ^ 0x8000000080000000));
            dVar13 = std::exp((double)((ulong)(uint)local_9d0 ^ 0x8000000080000000));
            local_a88 = 1.0 / (SUB84(dVar12,0) * (SUB84(dVar13,0) + 1.0) + 1.0);
            if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= local_a88) {
              in_stack_fffffffffffff240 = (float)local_9c8;
              in_stack_fffffffffffff244 = sigmoid(0.0);
              local_a8c = (in_stack_fffffffffffff240 + in_stack_fffffffffffff244) / (float)local_77c
              ;
              in_stack_fffffffffffff238 = (float)local_9c4;
              in_stack_fffffffffffff23c = sigmoid(0.0);
              local_a90 = (in_stack_fffffffffffff238 + in_stack_fffffffffffff23c) / (float)local_780
              ;
              dVar12 = std::exp((double)(ulong)*local_860);
              in_stack_fffffffffffff234 = SUB84(dVar12,0);
              local_a94 = (in_stack_fffffffffffff234 * local_7b0) / (float)local_79c;
              dVar12 = std::exp((double)(ulong)*local_8b0);
              in_stack_fffffffffffff230 = SUB84(dVar12,0);
              local_a98 = (in_stack_fffffffffffff230 * local_7b4) / (float)local_7a0;
              auVar14 = SUB6416(ZEXT464(0x3f000000),0);
              auVar2 = vfnmadd213ss_fma(auVar14,ZEXT416((uint)local_a94),ZEXT416((uint)local_a8c));
              local_ac4 = auVar2._0_4_;
              auVar2 = vfnmadd213ss_fma(auVar14,ZEXT416((uint)local_a98),ZEXT416((uint)local_a90));
              local_ac0 = auVar2._0_4_;
              auVar2 = vfmadd213ss_fma(auVar14,ZEXT416((uint)local_a94),ZEXT416((uint)local_a8c));
              local_abc = auVar2._0_4_;
              auVar2 = vfmadd213ss_fma(auVar14,ZEXT416((uint)local_a98),ZEXT416((uint)local_a90));
              local_ab8 = auVar2._0_4_;
              local_ab4 = local_a94 * local_a98;
              local_ac8 = local_a88;
              local_ab0 = local_9cc;
              local_aac = local_ab4;
              local_aa8 = local_ab8;
              local_aa4 = local_abc;
              local_aa0 = local_ac0;
              local_a9c = local_ac4;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_760,(long)local_7a4);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)in_stack_fffffffffffff1f8,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0));
            }
            local_7c0 = (void *)((long)local_7c0 + 4);
            local_810 = (void *)((long)local_810 + 4);
            local_860 = local_860 + 1;
            local_8b0 = local_8b0 + 1;
            local_900 = local_900 + 1;
          }
        }
        in_stack_fffffffffffff228 = &local_990;
        local_598 = in_stack_fffffffffffff228;
        local_250 = in_stack_fffffffffffff228;
        if (local_990.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          local_254 = 0xffffffff;
          LOCK();
          local_258 = (local_990.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->score;
          (local_990.
           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
           ._M_impl.super__Vector_impl_data._M_finish)->score =
               (float)((int)(local_990.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->score + -1);
          UNLOCK();
          if (local_258 == 1.4013e-45) {
            if (local_970 == (Allocator *)0x0) {
              if (local_990.
                  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(local_990.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*local_970->_vptr_Allocator[3])
                        (local_970,
                         local_990.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        (in_stack_fffffffffffff228->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_stack_fffffffffffff228->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined4 *)
         &in_stack_fffffffffffff228[1].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff228[1].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
        *(undefined4 *)
         ((long)&in_stack_fffffffffffff228[1].
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff228[2].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        *(undefined4 *)
         ((long)&in_stack_fffffffffffff228[2].
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff228[2].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        in_stack_fffffffffffff228[2].
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_stack_fffffffffffff228->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      for (local_acc = 0; local_acc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_acc = local_acc + 1) {
        local_ad8 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_760,(long)local_acc);
        local_ae8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff1e0);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  (in_stack_fffffffffffff1e8,
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffff1e0);
        local_af0 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffff1e0);
        local_af8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff1e0);
        __position._M_current._4_4_ = in_stack_fffffffffffff244;
        __position._M_current._0_4_ = in_stack_fffffffffffff240;
        __first._M_current._4_4_ = in_stack_fffffffffffff23c;
        __first._M_current._0_4_ = in_stack_fffffffffffff238;
        __last._M_current._4_4_ = in_stack_fffffffffffff234;
        __last._M_current._0_4_ = in_stack_fffffffffffff230;
        in_stack_fffffffffffff220 =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       (in_stack_fffffffffffff228,__position,__first,__last);
        local_b00 = in_stack_fffffffffffff220._M_current;
      }
      local_78c = 0;
    }
    else {
      local_704 = -1;
      local_78c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)in_stack_fffffffffffff1f8);
    if (local_78c != 0) goto LAB_01a3b9eb;
    local_748 = local_748 + 1;
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            (in_stack_fffffffffffff1f8,
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a3b624);
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff228,
             fVar16);
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a3b663);
  local_b38 = (Mat *)0x0;
  pYVar15 = in_stack_fffffffffffff1f8;
  while( true ) {
    this_00 = local_b38;
    pMVar7 = (Mat *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_b18);
    if (pMVar7 <= this_00) break;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_b18,(size_type)local_b38);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[](&local_740,*pvVar8);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)pYVar15,
                (value_type *)CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0));
    local_b38 = (Mat *)((long)&local_b38->data + 1);
  }
  sVar6 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_b30);
  if ((int)sVar6 == 0) {
    local_704 = 0;
    in_stack_fffffffffffff1f8 = pYVar15;
  }
  else {
    in_stack_fffffffffffff1f8 =
         (Yolov3DetectionOutput *)
         std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_720,0);
    Mat::create(this_00,in_stack_fffffffffffff204,in_stack_fffffffffffff200,(size_t)pYVar15,
                (Allocator *)CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0));
    bVar11 = true;
    if ((in_stack_fffffffffffff1f8->super_Layer)._vptr_Layer != (_func_int **)0x0) {
      bVar11 = (in_stack_fffffffffffff1f8->super_Layer).type.field_2._M_allocated_capacity *
               (long)(int)(in_stack_fffffffffffff1f8->super_Layer).type._M_string_length == 0;
      local_38 = in_stack_fffffffffffff1f8;
    }
    local_3f8 = in_stack_fffffffffffff1f8;
    if (bVar11) {
      local_704 = -100;
    }
    else {
      pYVar15 = in_stack_fffffffffffff1f8;
      for (local_b54 = 0; local_b54 < (int)sVar6; local_b54 = local_b54 + 1) {
        pvVar9 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_b30,(long)local_b54);
        fVar16 = pvVar9->score;
        local_3ec = local_b54;
        pp_Var10 = (_func_int **)
                   ((long)(in_stack_fffffffffffff1f8->super_Layer)._vptr_Layer +
                   (long)*(int *)&(in_stack_fffffffffffff1f8->super_Layer).field_0x2c *
                   (long)local_b54 *
                   *(size_t *)&(in_stack_fffffffffffff1f8->super_Layer).support_tensor_storage);
        *(float *)pp_Var10 = (float)(pvVar9->label + 1);
        *(float *)((long)pp_Var10 + 4) = fVar16;
        *(float *)(pp_Var10 + 1) = pvVar9->xmin;
        *(float *)((long)pp_Var10 + 0xc) = pvVar9->ymin;
        *(float *)(pp_Var10 + 2) = pvVar9->xmax;
        *(float *)((long)pp_Var10 + 0x14) = pvVar9->ymax;
        local_3e8 = in_stack_fffffffffffff1f8;
      }
      local_704 = 0;
      in_stack_fffffffffffff1f8 = pYVar15;
    }
  }
  local_78c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffff1f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff1f8);
LAB_01a3b9eb:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffff1f8);
  return local_704;
}

Assistant:

int Yolov3DetectionOutput_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}